

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

int xmlSchemaCompareNormStrings(xmlChar *x,xmlChar *y)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  
  while( true ) {
    uVar3 = (ulong)*x;
    if ((0x20 < uVar3) || ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0)) break;
    x = x + 1;
  }
  while ((uVar5 = (ulong)*y, uVar5 < 0x21 && ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0))) {
    y = y + 1;
  }
  if (*x != 0) {
    while (bVar4 = (byte)uVar5, bVar4 != 0) {
      bVar2 = (byte)uVar3;
      if ((bVar2 < 0x21) && ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0)) {
        if ((0x20 < bVar4) || ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0)) {
          return (int)uVar3 - (int)uVar5;
        }
        while (((byte)uVar3 < 0x21 && ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0))) {
          pbVar1 = x + 1;
          x = x + 1;
          uVar3 = (ulong)*pbVar1;
        }
        while (((byte)uVar5 < 0x21 && ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0))) {
          pbVar1 = y + 1;
          y = y + 1;
          uVar5 = (ulong)*pbVar1;
        }
      }
      else {
        if (bVar2 < bVar4) {
          return -1;
        }
        if (bVar2 != bVar4) {
          return 1;
        }
        y = y + 1;
        uVar3 = (ulong)x[1];
        x = x + 1;
      }
      if ((char)uVar3 == '\0') goto LAB_001af172;
      uVar5 = (ulong)*y;
    }
    while( true ) {
      x = x + 1;
      if (0x20 < (byte)uVar3) {
        return 1;
      }
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
      uVar3 = (ulong)*x;
    }
    if (uVar3 != 0) {
      return 1;
    }
LAB_001af172:
    uVar5 = (ulong)*y;
  }
  if ((char)uVar5 == '\0') {
    return 0;
  }
  while( true ) {
    y = y + 1;
    if (0x20 < (byte)uVar5) {
      return -1;
    }
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) break;
    uVar5 = (ulong)*y;
  }
  if (uVar5 != 0) {
    return -1;
  }
  return 0;
}

Assistant:

static int
xmlSchemaCompareNormStrings(const xmlChar *x,
			    const xmlChar *y) {
    int tmp;

    while (IS_BLANK_CH(*x)) x++;
    while (IS_BLANK_CH(*y)) y++;
    while ((*x != 0) && (*y != 0)) {
	if (IS_BLANK_CH(*x)) {
	    if (!IS_BLANK_CH(*y)) {
		tmp = *x - *y;
		return(tmp);
	    }
	    while (IS_BLANK_CH(*x)) x++;
	    while (IS_BLANK_CH(*y)) y++;
	} else {
	    tmp = *x++ - *y++;
	    if (tmp < 0)
		return(-1);
	    if (tmp > 0)
		return(1);
	}
    }
    if (*x != 0) {
	while (IS_BLANK_CH(*x)) x++;
	if (*x != 0)
	    return(1);
    }
    if (*y != 0) {
	while (IS_BLANK_CH(*y)) y++;
	if (*y != 0)
	    return(-1);
    }
    return(0);
}